

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# end.c
# Opt level: O3

long calc_score(int how)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  
  bVar1 = deepest_lev_reached('\0');
  lVar3 = money_cnt(invent);
  lVar7 = (long)u.umoney0;
  lVar4 = hidden_gold();
  uVar5 = (lVar4 + lVar3) - lVar7;
  uVar8 = 0;
  if (0 < (long)uVar5) {
    uVar8 = uVar5;
  }
  if (how < 0xc) {
    uVar8 = uVar8 - uVar8 / 10;
  }
  iVar2 = u.urscore + (char)bVar1 * 0x32 + (int)uVar8 + -0x32;
  if ('\x14' < (char)bVar1) {
    iVar6 = 10000;
    if (bVar1 < 0x1f) {
      iVar6 = (char)bVar1 * 1000 + -20000;
    }
    iVar2 = iVar2 + iVar6;
  }
  u.urscore = iVar2 << ((how & 0xfffffffeU) == 0x10);
  return lVar4 + lVar3;
}

Assistant:

static long calc_score(int how)
{
	long umoney;
	long tmp;
	int deepest = deepest_lev_reached(FALSE);

	umoney = money_cnt(invent);
	tmp = u.umoney0;
	umoney += hidden_gold();	/* accumulate gold from containers */
	tmp = umoney - tmp;		/* net gain */

	if (tmp < 0L)
	    tmp = 0L;
	if (how < PANICKED)
	    tmp -= tmp / 10L;
	u.urscore += tmp;
	u.urscore += 50L * (long)(deepest - 1);
	if (deepest > 20)
	    u.urscore += 1000L * (long)((deepest > 30) ? 10 : deepest - 20);
	if (how == ASCENDED || how == DEFIED) u.urscore *= 2L;

	return umoney;
}